

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void AssignRegisters(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  RegSlot RVar4;
  ScopeType SVar5;
  LocalFunctionId LVar6;
  PropertyId PVar7;
  uint32 uVar8;
  ParseNodeUni *pPVar9;
  ParseNodeBin *pPVar10;
  ParseNodeParamPattern *pPVar11;
  ParseNodeName *pPVar12;
  ParseNodeTri *pPVar13;
  ParseNodeWith *pPVar14;
  ParseNodeVar *pPVar15;
  ParseNodeVar *pPVar16;
  Symbol *pSVar17;
  ParseNodeCall *pPVar18;
  ParseNodeSwitch *pPVar19;
  ParseNodeCase *pPVar20;
  ParseNodeForInOrForOf *pPVar21;
  FunctionBody *pFVar22;
  ParseNodeInt *pPVar23;
  ParseNodeFloat *pPVar24;
  ParseNodeStr *pPVar25;
  Scope *pSVar26;
  FuncInfo *pFVar27;
  Scope *pSVar28;
  CharacterBuffer<char16_t> *pCVar29;
  char16_t *pcVar30;
  ParseNodeFor *pPVar31;
  ParseNodeBlock *pPVar32;
  ParseNodeFor *pPVar33;
  ParseNodeFnc *pPVar34;
  FuncInfo *pFVar35;
  ParseNodeReturn *pPVar36;
  ParseNodeStrTemplate *pPVar37;
  undefined4 *puVar38;
  ParseNodeExportDefault *pPVar39;
  char16_t *local_c8;
  char16_t *local_c0;
  Symbol *local_a8;
  ParseNode *expr;
  ParseNode *pnodeExprs;
  ParseNode *pnodeExpr;
  FuncInfo *funcInfo_3;
  CharacterBuffer<char16_t> symName_1;
  FuncInfo *funcInfo_2;
  FuncInfo *funcInfo_1;
  FuncInfo *topFunc;
  ParseNodeForInOrForOf *pnodeForOf;
  Symbol *functionScopeVarSym;
  ParseNodePtr pnodeName;
  FuncInfo *funcInfo;
  Symbol *symName;
  uint flags;
  OpCode nop;
  Symbol *sym;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  switch(pnode->nop) {
  case knopName:
    pPVar12 = ParseNode::AsParseNodeName(pnode);
    pSVar17 = pPVar12->sym;
    if (pSVar17 == (Symbol *)0x0) {
      pPVar12 = ParseNode::AsParseNodeName(pnode);
      PVar7 = Ident::GetPropertyId(pPVar12->pid);
      if (PVar7 == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13fd,
                           "(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty)"
                           ,
                           "pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 0;
      }
      bVar2 = ByteCodeGenerator::IsThis(pnode);
      if (bVar2) {
        pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        pSVar17 = FuncInfo::GetThisSymbol(pFVar35);
        if ((pSVar17 == (Symbol *)0x0) &&
           (uVar8 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar8 & 0x400) == 0)) {
          ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
          ByteCodeGenerator::AssignThisConstRegister(byteCodeGenerator);
        }
      }
    }
    else {
      bVar2 = Symbol::GetIsGlobal(pSVar17);
      if ((!bVar2) && (bVar2 = Symbol::GetIsMember(pSVar17), !bVar2)) {
        pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        pSVar26 = Symbol::GetScope(pSVar17);
        pFVar27 = Scope::GetEnclosingFunc(pSVar26);
        if (pFVar35 == pFVar27) {
          pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          bVar2 = Symbol::IsInSlot(pSVar17,byteCodeGenerator,pFVar35,false);
          if ((!bVar2) && (bVar2 = Symbol::HasVisitedCapturingFunc(pSVar17), !bVar2)) {
            pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
            uVar3 = Js::FunctionProxy::GetSourceContextId
                              (&pFVar35->byteCodeFunction->super_FunctionProxy);
            pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
            LVar6 = Js::FunctionProxy::GetLocalFunctionId
                              (&pFVar35->byteCodeFunction->super_FunctionProxy);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,DelayCapturePhase,uVar3,LVar6);
            if (bVar2) {
              pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
              bVar2 = Symbol::NeedsSlotAlloc(pSVar17,byteCodeGenerator,pFVar35);
              if (bVar2) {
                pCVar29 = Symbol::GetName(pSVar17);
                pcVar30 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(pCVar29);
                Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\'.\n",pcVar30);
                Output::Flush();
              }
            }
            ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar17);
            bVar2 = ByteCodeGenerator::HasInterleavingDynamicScope(byteCodeGenerator,pSVar17);
            if (!bVar2) {
              RVar4 = Symbol::GetLocation(pSVar17);
              pnode->location = RVar4;
            }
          }
        }
      }
    }
    bVar2 = ParseNode::IsInList(pnode);
    if ((bVar2) && (bVar2 = ParseNode::IsNotEscapedUse(pnode), !bVar2)) {
      CheckMaybeEscapedUse(pnode,byteCodeGenerator,false);
    }
    break;
  case knopInt:
    pPVar23 = ParseNode::AsParseNodeInt(pnode);
    RVar4 = ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,pPVar23->lw);
    pnode->location = RVar4;
    break;
  case knopBigInt:
    RVar4 = ByteCodeGenerator::EnregisterBigIntConstant(byteCodeGenerator,pnode);
    pnode->location = RVar4;
    break;
  default:
    uVar3 = ParseNode::Grfnop((uint)pnode->nop);
    if ((uVar3 & 4) == 0) {
      if ((uVar3 & 8) != 0) {
        pPVar10 = ParseNode::AsParseNodeBin(pnode);
        CheckMaybeEscapedUse(pPVar10->pnode1,byteCodeGenerator,false);
        pPVar10 = ParseNode::AsParseNodeBin(pnode);
        CheckMaybeEscapedUse(pPVar10->pnode2,byteCodeGenerator,false);
      }
    }
    else {
      pPVar9 = ParseNode::AsParseNodeUni(pnode);
      CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    }
    break;
  case knopFlt:
    pPVar24 = ParseNode::AsParseNodeFloat(pnode);
    RVar4 = ByteCodeGenerator::EnregisterDoubleConstant(byteCodeGenerator,pPVar24->dbl);
    pnode->location = RVar4;
    break;
  case knopStr:
    pPVar25 = ParseNode::AsParseNodeStr(pnode);
    RVar4 = ByteCodeGenerator::EnregisterStringConstant(byteCodeGenerator,pPVar25->pid);
    pnode->location = RVar4;
    break;
  case knopNull:
    RVar4 = ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    pnode->location = RVar4;
    break;
  case knopFalse:
    RVar4 = ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    pnode->location = RVar4;
    break;
  case knopTrue:
    RVar4 = ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
    pnode->location = RVar4;
    break;
  case knopYieldLeaf:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    break;
  case knopEllipsis:
    bVar2 = ByteCodeGenerator::InDestructuredPattern(byteCodeGenerator);
    if (bVar2) {
      RVar4 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
      pnode->location = RVar4;
      ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
    }
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopIncPost:
  case knopDecPost:
  case knopIncPre:
  case knopDecPre:
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,1);
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopObject:
  case knopCoalesce:
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    break;
  case knopYield:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopYieldStar:
    RVar4 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar4;
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopAwait:
    AssignAwaitRegisters(byteCodeGenerator);
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopCall:
    pPVar18 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar18->pnodeTarget->nop != knopIndex) &&
       (pPVar18 = ParseNode::AsParseNodeCall(pnode), pPVar18->pnodeTarget->nop != knopDot)) {
      ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    }
    pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    pPVar18 = ParseNode::AsParseNodeCall(pnode);
    if (((byte)pPVar18->field_0x24 >> 2 & 1) != 0) {
      pFVar22 = FuncInfo::GetParsedFunctionBody(pFVar35);
      bVar2 = Js::ParseableFunctionInfo::IsReparsed(&pFVar22->super_ParseableFunctionInfo);
      if (bVar2) {
        pFVar22 = FuncInfo::GetParsedFunctionBody(pFVar35);
        bVar2 = Js::FunctionBody::GetCallsEval(pFVar22);
        pPVar18 = ParseNode::AsParseNodeCall(pnode);
        pPVar18->field_0x24 = pPVar18->field_0x24 & 0xfb | bVar2 << 2;
      }
      else {
        bVar2 = FuncInfo::IsGlobalFunction(pFVar35);
        if ((!bVar2) && (bVar2 = FuncInfo::GetCallsEval(pFVar35), !bVar2)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x1383,"(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval())",
                             "funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 0;
        }
        FuncInfo::SetCallsEval(pFVar35,true);
        pFVar22 = FuncInfo::GetParsedFunctionBody(pFVar35);
        Js::FunctionBody::SetCallsEval(pFVar22,true);
      }
    }
    break;
  case knopDot:
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    CheckMaybeEscapedUse(pPVar10->pnode1,byteCodeGenerator,false);
    break;
  case knopAsg:
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    if (pPVar10->pnode1->nop == knopName) {
      pPVar10 = ParseNode::AsParseNodeBin(pnode);
      pPVar12 = ParseNode::AsParseNodeName(pPVar10->pnode1);
      local_a8 = pPVar12->sym;
    }
    else {
      local_a8 = (Symbol *)0x0;
    }
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    CheckFuncAssignment(local_a8,pPVar10->pnode2,byteCodeGenerator);
    bVar2 = ParseNode::IsInList(pnode);
    if (bVar2) {
      pPVar10 = ParseNode::AsParseNodeBin(pnode);
      CheckMaybeEscapedUse(pPVar10->pnode1,byteCodeGenerator,false);
    }
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    if ((pPVar10->pnode1->nop == knopArrayPattern) ||
       (pPVar10 = ParseNode::AsParseNodeBin(pnode), pPVar10->pnode1->nop == knopObjectPattern)) {
      ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
      ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
    }
    break;
  case knopComma:
    bVar2 = ParseNode::IsNotEscapedUse(pnode);
    if (!bVar2) {
      pPVar10 = ParseNode::AsParseNodeBin(pnode);
      CheckMaybeEscapedUse(pPVar10->pnode2,byteCodeGenerator,false);
    }
    break;
  case knopNew:
    pPVar18 = ParseNode::AsParseNodeCall(pnode);
    CheckMaybeEscapedUse(pPVar18->pnodeTarget,byteCodeGenerator,false);
    pPVar18 = ParseNode::AsParseNodeCall(pnode);
    CheckMaybeEscapedUse(pPVar18->pnodeArgs,byteCodeGenerator,false);
    break;
  case knopQmark:
    pPVar13 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar13->pnode1,byteCodeGenerator,false);
    pPVar13 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar13->pnode2,byteCodeGenerator,false);
    pPVar13 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar13->pnode3,byteCodeGenerator,false);
    break;
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    CheckMaybeEscapedUse(pPVar10->pnode2,byteCodeGenerator,false);
    break;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar16 = ParseNode::AsParseNodeVar(pnode);
    _flags = pPVar16->sym;
    if (_flags == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar38 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13aa,"(sym != nullptr)","sym != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar38 = 0;
    }
    pSVar26 = Symbol::GetScope(_flags);
    pFVar35 = Scope::GetEnclosingFunc(pSVar26);
    pFVar27 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    if (pFVar35 != pFVar27) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar38 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13ac,
                         "(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo())"
                         ,"sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar38 = 0;
    }
    pPVar16 = ParseNode::AsParseNodeVar(pnode);
    if ((pPVar16->isBlockScopeFncDeclVar != '\0') && (bVar2 = Symbol::GetIsBlockVar(_flags), bVar2))
    {
      return;
    }
    bVar2 = Symbol::GetIsGlobal(_flags);
    if (bVar2) {
      pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      bVar2 = FuncInfo::IsGlobalFunction(pFVar35);
      if (bVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar38 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13e3,"(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())",
                         "byteCodeGenerator->TopFuncInfo()->IsGlobalFunction()");
      if (bVar2) {
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    symName_1._8_8_ = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    pPVar16 = ParseNode::AsParseNodeVar(pnode);
    CheckFuncAssignment(_flags,pPVar16->pnodeInit,byteCodeGenerator);
    bVar2 = Symbol::GetIsCatch(_flags);
    if (bVar2) {
      pPVar16 = ParseNode::AsParseNodeVar(pnode);
      pSVar26 = Symbol::GetScope(pPVar16->sym);
      SVar5 = Scope::GetScopeType(pSVar26);
      if (SVar5 == ScopeType_CatchParamPattern) goto LAB_00b726c7;
LAB_00b726fc:
      bVar2 = Symbol::GetIsCatch(_flags);
      if ((!bVar2) &&
         (pSVar26 = *(Scope **)(symName_1._8_8_ + 0x1d8), pSVar28 = Symbol::GetScope(_flags),
         pSVar26 == pSVar28)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13c5,"(funcInfo->bodyScope != sym->GetScope())",
                           "funcInfo->bodyScope != sym->GetScope()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 0;
      }
      pCVar29 = Symbol::GetName(_flags);
      JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                ((CharacterBuffer<char16_t> *)&funcInfo_3,pCVar29);
      _flags = Scope::FindLocalSymbol
                         (*(Scope **)(symName_1._8_8_ + 0x1d8),(SymbolName *)&funcInfo_3);
      if (_flags == (Symbol *)0x0) {
        _flags = Scope::FindLocalSymbol
                           (*(Scope **)(symName_1._8_8_ + 0x1d0),(SymbolName *)&funcInfo_3);
      }
      if (((_flags == (Symbol *)0x0) || (bVar2 = Symbol::GetIsCatch(_flags), bVar2)) ||
         (bVar2 = Symbol::GetIsBlockVar(_flags), bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13cf,"((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()))",
                           "(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar38 = 0;
      }
    }
    else {
LAB_00b726c7:
      if (((pnode->nop == knopVarDecl) && (bVar2 = Symbol::GetIsBlockVar(_flags), bVar2)) &&
         (pPVar16 = ParseNode::AsParseNodeVar(pnode), pPVar16->isBlockScopeFncDeclVar == '\0'))
      goto LAB_00b726fc;
    }
    bVar2 = Symbol::GetIsGlobal(_flags);
    if ((!bVar2) &&
       (bVar2 = Symbol::IsInSlot(_flags,byteCodeGenerator,(FuncInfo *)symName_1._8_8_,false), !bVar2
       )) {
      uVar3 = Js::FunctionProxy::GetSourceContextId(*(FunctionProxy **)(symName_1._8_8_ + 0x1f0));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(symName_1._8_8_ + 0x1f0));
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,DelayCapturePhase,uVar3,LVar6);
      if (bVar2) {
        pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        bVar2 = Symbol::NeedsSlotAlloc(_flags,byteCodeGenerator,pFVar35);
        if (bVar2) {
          pCVar29 = Symbol::GetName(_flags);
          pcVar30 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(pCVar29);
          Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\' during initialization.\n"
                        ,pcVar30);
          Output::Flush();
        }
      }
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,_flags);
    }
    break;
  case knopFncDecl:
    pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar2 = FuncInfo::IsGlobalFunction(pFVar35);
    if (!bVar2) {
      pPVar34 = ParseNode::AsParseNodeFnc(pnode);
      bVar2 = ParseNodeFnc::IsCoroutine(pPVar34);
      if (bVar2) {
        pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar35,L"Generator");
      }
      bVar2 = ParseNode::IsInList(pnode);
      if ((bVar2) && (bVar2 = ParseNode::IsNotEscapedUse(pnode), !bVar2)) {
        pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar35,L"InList");
      }
      pPVar34 = ParseNode::AsParseNodeFnc(pnode);
      pPVar16 = pPVar34->pnodeName;
      if (pPVar16 != (ParseNodeVar *)0x0) {
        if (((pPVar16->super_ParseNode).nop == knopVarDecl) &&
           (pPVar15 = ParseNode::AsParseNodeVar(&pPVar16->super_ParseNode),
           pPVar15->sym != (Symbol *)0x0)) {
          pPVar15 = ParseNode::AsParseNodeVar(&pPVar16->super_ParseNode);
          Symbol::SetHasFuncAssignment(pPVar15->sym,byteCodeGenerator);
          pPVar16 = ParseNode::AsParseNodeVar(&pPVar16->super_ParseNode);
          pSVar17 = Symbol::GetFuncScopeVarSym(pPVar16->sym);
          if (pSVar17 != (Symbol *)0x0) {
            Symbol::SetHasFuncAssignment(pSVar17,byteCodeGenerator);
          }
        }
        else {
          pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          if ((pPVar16->super_ParseNode).nop == knopList) {
            local_c0 = L"MultipleFuncName";
          }
          else {
            if ((pPVar16->super_ParseNode).nop == knopDot) {
              local_c8 = L"PropFuncName";
            }
            else {
              bVar2 = false;
              if ((pPVar16->super_ParseNode).nop == knopVarDecl) {
                pPVar16 = ParseNode::AsParseNodeVar(&pPVar16->super_ParseNode);
                bVar2 = pPVar16->sym == (Symbol *)0x0;
              }
              local_c8 = L"WeirdFuncName";
              if (bVar2) {
                local_c8 = L"WithScopeFuncName";
              }
            }
            local_c0 = local_c8;
          }
          FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar35,local_c0);
        }
      }
    }
    break;
  case knopClassDecl:
    pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar35,L"Class");
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    break;
  case knopProg:
    bVar2 = ByteCodeGenerator::HasParentScopeInfo(byteCodeGenerator);
    if (!bVar2) {
      pPVar34 = ParseNode::AsParseNodeFnc(pnode);
      PostVisitFunction(pPVar34,byteCodeGenerator);
    }
    break;
  case knopFor:
    pPVar31 = ParseNode::AsParseNodeFor(pnode);
    if ((pPVar31->pnodeBody != (ParseNodePtr)0x0) &&
       (pPVar31 = ParseNode::AsParseNodeFor(pnode), pPVar31->pnodeBody->nop == knopBlock)) {
      pPVar31 = ParseNode::AsParseNodeFor(pnode);
      pPVar32 = ParseNode::AsParseNodeBlock(pPVar31->pnodeBody);
      if (pPVar32->pnodeStmt != (ParseNodePtr)0x0) {
        pPVar31 = ParseNode::AsParseNodeFor(pnode);
        pPVar32 = ParseNode::AsParseNodeBlock(pPVar31->pnodeBody);
        if ((pPVar32->pnodeStmt->nop == knopFor) &&
           (bVar2 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator), !bVar2)) {
          pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          pPVar31 = InvertLoop(pnode,byteCodeGenerator,pFVar35);
          pPVar33 = ParseNode::AsParseNodeFor(pnode);
          pPVar33->pnodeInverted = pPVar31;
          return;
        }
      }
    }
    pPVar31 = ParseNode::AsParseNodeFor(pnode);
    pPVar31->pnodeInverted = (ParseNodeFor *)0x0;
    break;
  case knopForIn:
    pPVar21 = ParseNode::AsParseNodeForInOrForOf(pnode);
    CheckMaybeEscapedUse(pPVar21->pnodeObj,byteCodeGenerator,false);
    break;
  case knopForAwaitOf:
    AssignAwaitRegisters(byteCodeGenerator);
  case knopForOf:
    pPVar21 = ParseNode::AsParseNodeForInOrForOf(pnode);
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    RVar4 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pPVar21->shouldCallReturnFunctionLocation = RVar4;
    RVar4 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pPVar21->shouldCallReturnFunctionLocationFinally = RVar4;
    CheckMaybeEscapedUse(pPVar21->pnodeObj,byteCodeGenerator,false);
    break;
  case knopStrTemplate:
    pPVar37 = ParseNode::AsParseNodeStrTemplate(pnode);
    expr = pPVar37->pnodeSubstitutionExpressions;
    if (expr != (ParseNodePtr)0x0) {
      while (expr->nop == knopList) {
        pPVar10 = ParseNode::AsParseNodeBin(expr);
        if (pPVar10->pnode1 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x144b,"(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr)",
                             "pnodeExprs->AsParseNodeBin()->pnode1 != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 0;
        }
        pPVar10 = ParseNode::AsParseNodeBin(expr);
        if (pPVar10->pnode2 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x144c,"(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr)",
                             "pnodeExprs->AsParseNodeBin()->pnode2 != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar38 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar38 = 0;
        }
        pPVar10 = ParseNode::AsParseNodeBin(expr);
        CheckMaybeEscapedUse(pPVar10->pnode1,byteCodeGenerator,false);
        pPVar10 = ParseNode::AsParseNodeBin(expr);
        expr = pPVar10->pnode2;
      }
      CheckMaybeEscapedUse(expr,byteCodeGenerator,false);
    }
    pPVar37 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar37->field_0x2a & 1) != 0) {
      RVar4 = ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant(byteCodeGenerator,pnode);
      pnode->location = RVar4;
    }
    break;
  case knopWith:
    RVar4 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar4;
    pPVar14 = ParseNode::AsParseNodeWith(pnode);
    CheckMaybeEscapedUse(pPVar14->pnodeObj,byteCodeGenerator,false);
    break;
  case knopSwitch:
    pPVar19 = ParseNode::AsParseNodeSwitch(pnode);
    CheckMaybeEscapedUse(pPVar19->pnodeVal,byteCodeGenerator,false);
    break;
  case knopCase:
    pPVar20 = ParseNode::AsParseNodeCase(pnode);
    CheckMaybeEscapedUse(pPVar20->pnodeExpr,byteCodeGenerator,false);
    break;
  case knopReturn:
    pFVar35 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar2 = FuncInfo::IsAsyncGenerator(pFVar35);
    if (bVar2) {
      AssignAwaitRegisters(byteCodeGenerator);
    }
    pPVar36 = ParseNode::AsParseNodeReturn(pnode);
    CheckMaybeEscapedUse(pPVar36->pnodeExpr,byteCodeGenerator,false);
    break;
  case knopThrow:
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopObjectPattern:
  case knopArrayPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    CheckMaybeEscapedUse(pPVar9->pnode1,byteCodeGenerator,false);
    break;
  case knopParamPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    pPVar11 = ParseNode::AsParseNodeParamPattern(pnode);
    CheckMaybeEscapedUse((pPVar11->super_ParseNodeUni).pnode1,byteCodeGenerator,false);
    break;
  case knopExportDefault:
    pPVar39 = ParseNode::AsParseNodeExportDefault(pnode);
    if (pPVar39->pnodeExpr != (ParseNode *)0x0) {
      CheckMaybeEscapedUse(pPVar39->pnodeExpr,byteCodeGenerator,false);
    }
  }
  return;
}

Assistant:

void AssignRegisters(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
    {
        return;
    }

    Symbol *sym;
    OpCode nop = pnode->nop;
    switch (nop)
    {
    default:
        {
            uint flags = ParseNode::Grfnop(nop);
            if (flags & fnopUni)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
            }
            else if (flags & fnopBin)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
            }
        break;
    }

    case knopParamPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator);
        break;

    case knopObjectPattern:
    case knopArrayPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopDot:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
        break;
    case knopMember:
    case knopMemberShort:
    case knopGetMember:
    case knopSetMember:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        break;

    case knopAsg:
        {
            Symbol * symName = pnode->AsParseNodeBin()->pnode1->nop == knopName ? pnode->AsParseNodeBin()->pnode1->AsParseNodeName()->sym : nullptr;
            CheckFuncAssignment(symName, pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);

            if (pnode->IsInList())
            {
                // Assignment in array literal
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
            }

            if ((pnode->AsParseNodeBin()->pnode1->nop == knopArrayPattern || pnode->AsParseNodeBin()->pnode1->nop == knopObjectPattern))
            {
                // Destructured arrays may have default values and need undefined.
                byteCodeGenerator->AssignUndefinedConstRegister();

                // Any rest parameter in a destructured array will need a 0 constant.
                byteCodeGenerator->EnregisterConstant(0);
            }

        break;
    }

    case knopEllipsis:
        if (byteCodeGenerator->InDestructuredPattern())
        {
            // Get a register for the rest array counter.
            pnode->location = byteCodeGenerator->NextVarRegister();

            // Any rest parameter in a destructured array will need a 0 constant.
            byteCodeGenerator->EnregisterConstant(0);
        }
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopQmark:
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator);
        break;
    case knopWith:
        pnode->location = byteCodeGenerator->NextVarRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator);
        break;
    case knopComma:
        if (!pnode->IsNotEscapedUse())
        {
            // Only the last expr in comma expr escape. Mark it if it is escapable.
            CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        }
        break;
    case knopFncDecl:
        if (!byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())
        {
            if (pnode->AsParseNodeFnc()->IsCoroutine())
            {
                // Assume generators always escape; otherwise need to analyze if
                // the return value of calls to generator function, the generator
                // objects, escape.
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Generator")));
            }

            if (pnode->IsInList() && !pnode->IsNotEscapedUse())
            {
                byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InList")));
            }

            ParseNodePtr pnodeName = pnode->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                // REVIEW: does this apply now that compat mode is gone?
                // There is a weird case in compat mode where we may not have a sym assigned to a fnc decl's
                // name node if it is a named function declare inside 'with' that also assigned to something else
                // as well. Instead, We generate two knopFncDecl node one for parent function and one for the assignment.
                // Only the top one gets a sym, not the inner one.  The assignment in the 'with' will be using the inner
                // one.  Also we will detect that the assignment to a variable is an escape inside a 'with'.
                // Since we need the sym in the fnc decl's name, we just detect the escape here as "WithScopeFuncName".

                if (pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym != nullptr)
                {
                    // Unlike in CheckFuncAssignment, we don't check for interleaving
                    // dynamic scope ('with') here, because we also generate direct assignment for
                    // function decl's names

                    pnodeName->AsParseNodeVar()->sym->SetHasFuncAssignment(byteCodeGenerator);

                    // Function declaration in block scope and non-strict mode has a
                    // corresponding var sym that we assign to as well.  Need to
                    // mark that symbol as has func assignment as well.
                    Symbol * functionScopeVarSym = pnodeName->AsParseNodeVar()->sym->GetFuncScopeVarSym();
                    if (functionScopeVarSym)
                    {
                        functionScopeVarSym->SetHasFuncAssignment(byteCodeGenerator);
                    }
                }
                else
                {
                    // The function has multiple names, or assign to o.x or o::x
                    byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
                        pnodeName->nop == knopList ? _u("MultipleFuncName") :
                        pnodeName->nop == knopDot ? _u("PropFuncName") :
                        pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym == nullptr ? _u("WithScopeFuncName") :
                        _u("WeirdFuncName")
                    ));
                }
            }
        }

        break;
    case knopNew:
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator);
        break;
    case knopThrow:
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    // REVIEW: Technically, switch expr or case expr doesn't really escape as strict equal
    // doesn't cause the function to escape.
    case knopSwitch:
        CheckMaybeEscapedUse(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator);
        break;
    case knopCase:
        CheckMaybeEscapedUse(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator);
        break;

    // REVIEW: Technically, the object for GetForInEnumerator doesn't escape, except when cached,
    // which we can make work.
    case knopForIn:
        CheckMaybeEscapedUse(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator);
        break;

    case knopForAwaitOf:
        AssignAwaitRegisters(byteCodeGenerator);
        // Fall-through
    case knopForOf:
        {
            ParseNodeForInOrForOf* pnodeForOf = pnode->AsParseNodeForInOrForOf();
            byteCodeGenerator->AssignNullConstRegister();
            byteCodeGenerator->AssignUndefinedConstRegister();
            pnodeForOf->shouldCallReturnFunctionLocation = byteCodeGenerator->NextVarRegister();
            pnodeForOf->shouldCallReturnFunctionLocationFinally = byteCodeGenerator->NextVarRegister();
            CheckMaybeEscapedUse(pnodeForOf->pnodeObj, byteCodeGenerator);
        }
        break;

    case knopTrue:
        pnode->location = byteCodeGenerator->AssignTrueConstRegister();
        break;

    case knopFalse:
        pnode->location = byteCodeGenerator->AssignFalseConstRegister();
        break;

    case knopDecPost:
    case knopIncPost:
    case knopDecPre:
    case knopIncPre:
        byteCodeGenerator->EnregisterConstant(1);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopCoalesce:
    case knopObject:
        byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopClassDecl:
        {
            FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
            topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Class")));

            // We may need undefined for the 'this', e.g. calling a class expression
            byteCodeGenerator->AssignUndefinedConstRegister();

        break;
        }
    case knopNull:
        pnode->location = byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopCall:
    {
        if (pnode->AsParseNodeCall()->pnodeTarget->nop != knopIndex &&
            pnode->AsParseNodeCall()->pnodeTarget->nop != knopDot)
        {
            byteCodeGenerator->AssignUndefinedConstRegister();
        }

        FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

        if (pnode->AsParseNodeCall()->isEvalCall)
        {
            if (!funcInfo->GetParsedFunctionBody()->IsReparsed())
            {
                Assert(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval());
                funcInfo->SetCallsEval(true);
                funcInfo->GetParsedFunctionBody()->SetCallsEval(true);
            }
            else
            {
                // On reparsing, load the state from function Body, instead of using the state on the parse node,
                // as they might be different.
                pnode->AsParseNodeCall()->isEvalCall = funcInfo->GetParsedFunctionBody()->GetCallsEval();
            }
        }
        // Don't need to check pnode->AsParseNodeCall()->pnodeTarget even if it is a knopFncDecl,
        // e.g. (function(){})();
        // It is only used as a call, so don't count as an escape.
        // Although not assigned to a slot, we will still able to box it by boxing
        // all the stack function on the interpreter frame or the stack function link list
        // on a jitted frame
        break;
    }

    case knopInt:
        pnode->location = byteCodeGenerator->EnregisterConstant(pnode->AsParseNodeInt()->lw);
        break;
    case knopFlt:
    {
        pnode->location = byteCodeGenerator->EnregisterDoubleConstant(pnode->AsParseNodeFloat()->dbl);
        break;
    }
    case knopBigInt:
        pnode->location = byteCodeGenerator->EnregisterBigIntConstant(pnode);
        break;
    case knopStr:
        pnode->location = byteCodeGenerator->EnregisterStringConstant(pnode->AsParseNodeStr()->pid);
        break;
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        {
            sym = pnode->AsParseNodeVar()->sym;
            Assert(sym != nullptr);

            Assert(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo());

            if (pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar())
            {
                break;
            }

            if (!sym->GetIsGlobal())
            {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

                // Check the function assignment for the sym that we have, even if we remap it to function level sym below
                // as we are going assign to the original sym
                CheckFuncAssignment(sym, pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator);

                // If this is a destructured param case then it is a let binding and we don't have to look for duplicate symbol in the body
                if ((sym->GetIsCatch() && pnode->AsParseNodeVar()->sym->GetScope()->GetScopeType() != ScopeType_CatchParamPattern) || (pnode->nop == knopVarDecl && sym->GetIsBlockVar() && !pnode->AsParseNodeVar()->isBlockScopeFncDeclVar))
                {
                    // The LHS of the var decl really binds to the local symbol, not the catch or let symbol.
                    // But the assignment will go to the catch or let symbol. Just assign a register to the local
                    // so that it can get initialized to undefined.
#if DBG
                    if (!sym->GetIsCatch())
                    {
                        // Catch cannot be at function scope and let and var at function scope is redeclaration error.
                        Assert(funcInfo->bodyScope != sym->GetScope());
                    }
#endif
                    auto symName = sym->GetName();
                    sym = funcInfo->bodyScope->FindLocalSymbol(symName);

                    if (sym == nullptr)
                    {
                        sym = funcInfo->paramScope->FindLocalSymbol(symName);
                    }
                    Assert((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()));
                }
                // Don't give the declared var a register if it's in a closure, because the closure slot
                // is its true "home". (Need to check IsGlobal again as the sym may have changed above.)
                if (!sym->GetIsGlobal() && !sym->IsInSlot(byteCodeGenerator, funcInfo))
                {
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                        {
                            Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s' during initialization.\n"),
                                sym->GetName().GetBuffer());
                            Output::Flush();
                        }
                    }
                    byteCodeGenerator->AssignRegister(sym);
                }
            }
            else
            {
                Assert(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction());
            }

            break;
        }

    case knopFor:
        if ((pnode->AsParseNodeFor()->pnodeBody != nullptr) && (pnode->AsParseNodeFor()->pnodeBody->nop == knopBlock) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt != nullptr) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt->nop == knopFor) &&
            (!byteCodeGenerator->IsInDebugMode()))
        {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            pnode->AsParseNodeFor()->pnodeInverted = InvertLoop(pnode, byteCodeGenerator, funcInfo);
        }
        else
        {
            pnode->AsParseNodeFor()->pnodeInverted = nullptr;
        }

        break;

    case knopName:
        sym = pnode->AsParseNodeName()->sym;
        if (sym == nullptr)
        {
            Assert(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty);

            // Referring to 'this' with no var decl needs to load 'this' root value via LdThis from null
            if (ByteCodeGenerator::IsThis(pnode) && !byteCodeGenerator->TopFuncInfo()->GetThisSymbol() && !(byteCodeGenerator->GetFlags() & fscrEval))
            {
                byteCodeGenerator->AssignNullConstRegister();
                byteCodeGenerator->AssignThisConstRegister();
            }
        }
        else
        {
            // Note: don't give a register to a local if it's in a closure, because then the closure
            // is its true home.
            if (!sym->GetIsGlobal() &&
                !sym->GetIsMember() &&
                byteCodeGenerator->TopFuncInfo() == sym->GetScope()->GetEnclosingFunc() &&
                !sym->IsInSlot(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()) &&
                !sym->HasVisitedCapturingFunc())
            {
                if (PHASE_TRACE(Js::DelayCapturePhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
                {
                    if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                    {
                        Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s'.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                }

                // Local symbol being accessed in its own frame. Even if "with" or event
                // handler semantics make the binding ambiguous, it has a home location,
                // so assign it.
                byteCodeGenerator->AssignRegister(sym);

                // If we're in something like a "with" we'll need a scratch register to hold
                // the multiple possible values of the property.
                if (!byteCodeGenerator->HasInterleavingDynamicScope(sym))
                {
                    // We're not in a dynamic scope, or our home scope is nested within the dynamic scope, so we
                    // don't have to do dynamic binding. Just use the home location for this reference.
                    pnode->location = sym->GetLocation();
                }
            }
        }
        if (pnode->IsInList() && !pnode->IsNotEscapedUse())
        {
            // A node that is in a list is assumed to be escape, unless marked otherwise.
            // This includes array literal list/object literal list
            CheckMaybeEscapedUse(pnode, byteCodeGenerator);
        }
        break;

    case knopProg:
        if (!byteCodeGenerator->HasParentScopeInfo())
        {
            // If we're compiling a nested deferred function, don't pop the scope stack,
            // because we just want to leave it as-is for the emit pass.
            PostVisitFunction(pnode->AsParseNodeFnc(), byteCodeGenerator);
        }
        break;
    case knopReturn:
        {
            if (byteCodeGenerator->TopFuncInfo()->IsAsyncGenerator())
            {
                AssignAwaitRegisters(byteCodeGenerator);
            }
            ParseNode *pnodeExpr = pnode->AsParseNodeReturn()->pnodeExpr;
            CheckMaybeEscapedUse(pnodeExpr, byteCodeGenerator);
            break;
        }

    case knopStrTemplate:
        {
            ParseNode* pnodeExprs = pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions;
            if (pnodeExprs != nullptr)
            {
                while (pnodeExprs->nop == knopList)
                {
                    Assert(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr);
                    Assert(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr);

                    CheckMaybeEscapedUse(pnodeExprs->AsParseNodeBin()->pnode1, byteCodeGenerator);
                    pnodeExprs = pnodeExprs->AsParseNodeBin()->pnode2;
                }

                // Also check the final element in the list
                CheckMaybeEscapedUse(pnodeExprs, byteCodeGenerator);
            }

            if (pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
            {
                pnode->location = byteCodeGenerator->EnregisterStringTemplateCallsiteConstant(pnode);
            }
            break;
        }
    case knopExportDefault:
        {
            ParseNode* expr = pnode->AsParseNodeExportDefault()->pnodeExpr;

            if (expr != nullptr)
            {
                CheckMaybeEscapedUse(expr, byteCodeGenerator);
            }

            break;
        }
    case knopYieldLeaf:
        // The done property of the result object is set to false and the
        // value property is set to undefined
        byteCodeGenerator->AssignFalseConstRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        break;
    case knopAwait:
        AssignAwaitRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYield:
        // The done property of the result object is set to false
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYieldStar:
        // Reserve a local for our YieldStar loop so that the backend doesn't complain
        pnode->location = byteCodeGenerator->NextVarRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        byteCodeGenerator->AssignTrueConstRegister();
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    }
}